

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall dgMeshEffect::EndPolygon(dgMeshEffect *this,HaF64 tol)

{
  dgBigVector *pdVar1;
  dgBigVector *pdVar2;
  dgVertexAtribute *vertList;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  HaI32 HVar8;
  int *piVar9;
  dgEdge *pdVar10;
  uint uVar11;
  int iVar12;
  HaF64 HVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int local_114;
  undefined8 local_110;
  HaF64 local_108;
  uint local_fc;
  dgStack<int> attrIndexMap;
  dgStack<int> indexMap;
  HaI64 userdata [3];
  dgBigVector e1;
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  dgBigVector n;
  dgBigVector e2;
  
  local_108 = tol;
  dgStack<int>::dgStack(&indexMap,*(HaI32 *)&(this->super_dgRefCounter).field_0xc);
  dgStack<int>::dgStack(&attrIndexMap,this->m_atribCount);
  HVar8 = *(HaI32 *)&(this->super_dgRefCounter).field_0xc;
  uVar11 = HVar8 / 3;
  pdVar2 = this->m_points;
  piVar9 = dgStack<int>::operator[](&indexMap,0);
  HVar8 = dgVertexListToIndexList((HaF64 *)pdVar2,0x20,4,HVar8,piVar9,local_108);
  *(HaI32 *)&(this->super_dgRefCounter).field_0xc = HVar8;
  vertList = this->m_attib;
  HVar8 = this->m_atribCount;
  piVar9 = dgStack<int>::operator[](&attrIndexMap,0);
  HVar8 = dgVertexListToIndexList((HaF64 *)vertList,0x60,0xc,HVar8,piVar9,local_108);
  this->m_atribCount = HVar8;
  HVar13 = 0.0;
  uVar11 = ~((int)uVar11 >> 0x1f) & uVar11;
  do {
    if (uVar11 == 0) {
      dgPolyhedra::EndFace(&this->super_dgPolyhedra);
      RepairTJoints(this,true);
      free(attrIndexMap.super_dgStackBase.m_ptr);
      free(indexMap.super_dgStackBase.m_ptr);
      return;
    }
    iVar12 = SUB84(HVar13,0);
    local_fc = uVar11 - 1;
    piVar9 = dgStack<int>::operator[](&indexMap,iVar12);
    local_114 = *piVar9;
    piVar9 = dgStack<int>::operator[](&indexMap,iVar12 + 1);
    local_110 = CONCAT44(local_110._4_4_,*piVar9);
    local_108 = HVar13;
    piVar9 = dgStack<int>::operator[](&indexMap,iVar12 + 2);
    local_110 = CONCAT44(*piVar9,(int)local_110);
    dgTemplateVector<double>::operator-
              (&this->m_points[(int)local_110].super_dgTemplateVector<double>,
               &this->m_points[local_114].super_dgTemplateVector<double>);
    dgBigVector::dgBigVector(&e1,&e2.super_dgTemplateVector<double>);
    dgTemplateVector<double>::operator-
              (&this->m_points[local_110._4_4_].super_dgTemplateVector<double>,
               &this->m_points[local_114].super_dgTemplateVector<double>);
    dgBigVector::dgBigVector
              ((dgBigVector *)&e2.super_dgTemplateVector<double>,&n.super_dgTemplateVector<double>);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = e1.super_dgTemplateVector<double>.m_x;
    auVar20._8_8_ = e1.super_dgTemplateVector<double>.m_z;
    auVar20._0_8_ = e1.super_dgTemplateVector<double>.m_z;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = e2.super_dgTemplateVector<double>.m_x;
    auVar22._8_8_ = e2.super_dgTemplateVector<double>.m_z;
    auVar22._0_8_ = e2.super_dgTemplateVector<double>.m_z;
    auVar6._8_8_ = e1.super_dgTemplateVector<double>.m_z;
    auVar6._0_8_ = e1.super_dgTemplateVector<double>.m_y;
    auVar7._8_8_ = e2.super_dgTemplateVector<double>.m_z;
    auVar7._0_8_ = e2.super_dgTemplateVector<double>.m_y;
    auVar14 = vunpcklpd_avx(auVar20,auVar17);
    auVar15 = vunpcklpd_avx(auVar22,auVar15);
    auVar21._0_8_ = e2.super_dgTemplateVector<double>.m_y * auVar14._0_8_;
    auVar21._8_8_ = e2.super_dgTemplateVector<double>.m_z * auVar14._8_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = e2.super_dgTemplateVector<double>.m_x * e1.super_dgTemplateVector<double>.m_y;
    auVar14 = vfmsub231sd_fma(auVar14,auVar17,auVar7);
    local_98 = vfmsub213pd_fma(auVar15,auVar6,auVar21);
    local_88 = auVar14._0_8_;
    local_80 = e1.super_dgTemplateVector<double>.m_w;
    dgBigVector::dgBigVector
              ((dgBigVector *)&n.super_dgTemplateVector<double>,(dgTemplateVector<double> *)local_98
              );
    auVar16._8_8_ = 0;
    auVar16._0_8_ = n.super_dgTemplateVector<double>.m_x;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = n.super_dgTemplateVector<double>.m_z;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = n.super_dgTemplateVector<double>.m_y * n.super_dgTemplateVector<double>.m_y;
    auVar14 = vfmadd231sd_fma(auVar18,auVar16,auVar16);
    auVar14 = vfmadd213sd_fma(auVar19,auVar19,auVar14);
    if (9.999999960041972e-13 < auVar14._0_8_) {
      piVar9 = dgStack<int>::operator[](&attrIndexMap,SUB84(local_108,0));
      userdata[0] = (HaI64)*piVar9;
      piVar9 = dgStack<int>::operator[](&attrIndexMap,iVar12 + 1);
      userdata[1] = (HaI64)*piVar9;
      piVar9 = dgStack<int>::operator[](&attrIndexMap,iVar12 + 2);
      userdata[2] = (HaI64)*piVar9;
      pdVar10 = dgPolyhedra::AddFace(&this->super_dgPolyhedra,3,&local_114,userdata);
      if (pdVar10 == (dgEdge *)0x0) {
        iVar12 = *(int *)&(this->super_dgRefCounter).field_0xc;
        if (this->m_maxPointCount < iVar12 + 3) {
          __assert_fail("(m_pointCount + 3) <= m_maxPointCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                        ,0x471,"void dgMeshEffect::EndPolygon(hacd::HaF64)");
        }
        pdVar2 = this->m_points + local_114;
        dVar3 = (pdVar2->super_dgTemplateVector<double>).m_y;
        dVar4 = (pdVar2->super_dgTemplateVector<double>).m_z;
        dVar5 = (pdVar2->super_dgTemplateVector<double>).m_w;
        pdVar1 = this->m_points + iVar12;
        (pdVar1->super_dgTemplateVector<double>).m_x = (pdVar2->super_dgTemplateVector<double>).m_x;
        (pdVar1->super_dgTemplateVector<double>).m_y = dVar3;
        (pdVar1->super_dgTemplateVector<double>).m_z = dVar4;
        (pdVar1->super_dgTemplateVector<double>).m_w = dVar5;
        pdVar2 = this->m_points + (int)local_110;
        dVar3 = (pdVar2->super_dgTemplateVector<double>).m_y;
        dVar4 = (pdVar2->super_dgTemplateVector<double>).m_z;
        dVar5 = (pdVar2->super_dgTemplateVector<double>).m_w;
        pdVar1 = this->m_points + (long)*(int *)&(this->super_dgRefCounter).field_0xc + 1;
        (pdVar1->super_dgTemplateVector<double>).m_x = (pdVar2->super_dgTemplateVector<double>).m_x;
        (pdVar1->super_dgTemplateVector<double>).m_y = dVar3;
        (pdVar1->super_dgTemplateVector<double>).m_z = dVar4;
        (pdVar1->super_dgTemplateVector<double>).m_w = dVar5;
        pdVar2 = this->m_points + local_110._4_4_;
        dVar3 = (pdVar2->super_dgTemplateVector<double>).m_y;
        dVar4 = (pdVar2->super_dgTemplateVector<double>).m_z;
        dVar5 = (pdVar2->super_dgTemplateVector<double>).m_w;
        pdVar1 = this->m_points + (long)*(int *)&(this->super_dgRefCounter).field_0xc + 2;
        (pdVar1->super_dgTemplateVector<double>).m_x = (pdVar2->super_dgTemplateVector<double>).m_x;
        (pdVar1->super_dgTemplateVector<double>).m_y = dVar3;
        (pdVar1->super_dgTemplateVector<double>).m_z = dVar4;
        (pdVar1->super_dgTemplateVector<double>).m_w = dVar5;
        local_114 = *(int *)&(this->super_dgRefCounter).field_0xc;
        auVar14 = vpbroadcastd_avx512vl();
        auVar14 = vpaddd_avx(auVar14,_DAT_00f4d7c0);
        local_110 = auVar14._0_8_;
        *(int *)&(this->super_dgRefCounter).field_0xc = local_114 + 3;
        dgPolyhedra::AddFace(&this->super_dgPolyhedra,3,&local_114,userdata);
      }
    }
    HVar13 = (HaF64)(ulong)(SUB84(local_108,0) + 3);
    uVar11 = local_fc;
  } while( true );
}

Assistant:

void dgMeshEffect::EndPolygon (hacd::HaF64 tol)
{
	dgStack<hacd::HaI32>indexMap(m_pointCount);
	dgStack<hacd::HaI32>attrIndexMap(m_atribCount);

#ifdef _DEBUG
	for (hacd::HaI32 i = 0; i < m_pointCount; i += 3) {
		dgBigVector p0 (m_points[i + 0]);
		dgBigVector p1 (m_points[i + 1]);
		dgBigVector p2 (m_points[i + 2]);
		dgBigVector e1 (p1 - p0);
		dgBigVector e2 (p2 - p0);
		dgBigVector n (e1 * e2);
		hacd::HaF64 mag2 = n % n;
//		HACD_ASSERT (mag2 > DG_MESH_EFFECT_TRIANGLE_MIN_AREA);
		HACD_ASSERT (mag2 > hacd::HaF32 (0.0f));
	}
#endif

	hacd::HaI32 triangCount = m_pointCount / 3;
	m_pointCount = dgVertexListToIndexList (&m_points[0].m_x, sizeof (dgBigVector), sizeof (dgBigVector)/sizeof (hacd::HaF64), m_pointCount, &indexMap[0], tol);
	m_atribCount = dgVertexListToIndexList (&m_attib[0].m_vertex.m_x, sizeof (dgVertexAtribute), sizeof (dgVertexAtribute)/sizeof (hacd::HaF64), m_atribCount, &attrIndexMap[0], tol);

	for (hacd::HaI32 i = 0; i < triangCount; i ++) {
		hacd::HaI32 index[3];
		hacd::HaI64 userdata[3];

		index[0] = indexMap[i * 3 + 0];
		index[1] = indexMap[i * 3 + 1];
		index[2] = indexMap[i * 3 + 2];


		dgBigVector e1 (m_points[index[1]] - m_points[index[0]]);
		dgBigVector e2 (m_points[index[2]] - m_points[index[0]]);

		dgBigVector n (e1 * e2);
		hacd::HaF64 mag2 = n % n;
		if (mag2 > hacd::HaF64 (1.0e-12f)) {
			userdata[0] = attrIndexMap[i * 3 + 0];
			userdata[1] = attrIndexMap[i * 3 + 1];
			userdata[2] = attrIndexMap[i * 3 + 2];
			dgEdge* const edge = AddFace (3, index, userdata);
			if (!edge) {
				HACD_ASSERT ((m_pointCount + 3) <= m_maxPointCount);

				m_points[m_pointCount + 0] = m_points[index[0]];
				m_points[m_pointCount + 1] = m_points[index[1]];
				m_points[m_pointCount + 2] = m_points[index[2]];

				index[0] = m_pointCount + 0;
				index[1] = m_pointCount + 1;
				index[2] = m_pointCount + 2;

				m_pointCount += 3;

				#ifdef _DEBUG
					dgEdge* test = AddFace (3, index, userdata);
					HACD_ASSERT (test);
				#else 
					AddFace (3, index, userdata);
				#endif
			}
		}
	}
	EndFace();

	RepairTJoints (true);


#ifdef _DEBUG
	dgPolyhedra::Iterator iter (*this);	
	for (iter.Begin(); iter; iter ++){
		dgEdge* const face = &(*iter);
		if (face->m_incidentFace > 0) {
			dgBigVector p0 (m_points[face->m_incidentVertex]);
			dgBigVector p1 (m_points[face->m_next->m_incidentVertex]);
			dgBigVector p2 (m_points[face->m_next->m_next->m_incidentVertex]);
			dgBigVector e1 (p1 - p0);
			dgBigVector e2 (p2 - p0);
			dgBigVector n (e1 * e2);
//			HACD_ASSERT (mag2 > DG_MESH_EFFECT_TRIANGLE_MIN_AREA);
			hacd::HaF64 mag2 = n % n;
			HACD_ASSERT (mag2 > hacd::HaF32 (0.0f));
		}
	}
#endif
}